

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtexture.cpp
# Opt level: O0

void __thiscall FPNGTexture::~FPNGTexture(FPNGTexture *this)

{
  FPNGTexture *this_local;
  
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FPNGTexture_00a085b8;
  (*(this->super_FTexture)._vptr_FTexture[9])();
  if (this->Spans != (Span **)0x0) {
    FTexture::FreeSpans(&this->super_FTexture,this->Spans);
    this->Spans = (Span **)0x0;
  }
  if ((this->PaletteMap != (BYTE *)0x0) && (this->PaletteMap != FTexture::GrayMap)) {
    if (this->PaletteMap != (BYTE *)0x0) {
      operator_delete__(this->PaletteMap);
    }
    this->PaletteMap = (BYTE *)0x0;
  }
  FString::~FString(&this->SourceFile);
  FTexture::~FTexture(&this->super_FTexture);
  return;
}

Assistant:

FPNGTexture::~FPNGTexture ()
{
	Unload ();
	if (Spans != NULL)
	{
		FreeSpans (Spans);
		Spans = NULL;
	}
	if (PaletteMap != NULL && PaletteMap != GrayMap)
	{
		delete[] PaletteMap;
		PaletteMap = NULL;
	}
}